

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbString.cpp
# Opt level: O0

void __thiscall Hpipe::CbString::CbString(CbString *this,CbStringPtr *bs,PT b_off,PT b_len)

{
  anon_class_24_3_09656f79 local_40;
  PT local_28;
  PT b_len_local;
  PT b_off_local;
  CbStringPtr *bs_local;
  CbString *this_local;
  
  this->beg = (Buffer *)0x0;
  this->off = 0;
  this->end = 0;
  if (b_len != 0) {
    local_40.b_off = &b_len_local;
    local_40.this = this;
    local_40.b_len = b_len;
    local_28 = b_len;
    b_len_local = b_off;
    b_off_local = (PT)bs;
    bs_local = (CbStringPtr *)this;
    CbStringPtr::
    visitor<Hpipe::CbString::CbString(Hpipe::CbStringPtr_const&,unsigned_long,unsigned_long)::__0>
              (bs,&local_40);
  }
  return;
}

Assistant:

CbString::CbString( const CbStringPtr &bs, PT b_off, PT b_len ) : beg( 0 ), off( 0 ), end( 0 ) {
    if ( not b_len )
        return;
    bs.visitor( [ this, &b_off, b_len ]( const Buffer *b, PT bd, PT ed ) {
        PT sd = ed - bd;
        // we have to take this buffer ?
        if ( b_off < sd ) {
            Buffer::inc_ref( b );

            // first buffer in this ?
            if ( not beg ) {
                beg = b;
                off = bd + b_off;
                end = off + b_len;
            }

            // that was the last buffer ?
            if ( b_off + b_len <= sd )
                return false;
            b_off = 0;
        } else
            b_off -= sd;
        return true;
    } );
}